

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppm_image.hpp
# Opt level: O2

vector __thiscall sisl::utility::ppm_image::calc_minmax(ppm_image *this)

{
  ppm_image *ppVar1;
  DenseStorage<double,__1,__1,_1,_0> *other;
  Scalar *pSVar2;
  Index extraout_RDX;
  ulong uVar3;
  uint d0;
  array_n<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_2,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  *in_RSI;
  vector vVar4;
  double local_78;
  double local_70;
  double max;
  double min;
  ppm_image *local_58;
  vector data;
  
  data.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data._0_4_ = 2;
  local_58 = this;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>
            ((Matrix<double,__1,_1,_0,__1,_1> *)this,(int *)&data);
  min = INFINITY;
  max = -INFINITY;
  local_70 = INFINITY;
  local_78 = -INFINITY;
  for (d0 = 0; ppVar1 = local_58, (int)d0 < *(int *)((long)&in_RSI[1]._array + 4); d0 = d0 + 1) {
    for (uVar3 = 0; (int)uVar3 < *(int *)&in_RSI[1]._array; uVar3 = (ulong)((int)uVar3 + 1)) {
      other = (DenseStorage<double,__1,__1,_1,_0> *)
              array_n<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_2,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
              ::operator()(in_RSI,d0,uVar3);
      Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
                ((DenseStorage<double,__1,__1,_1,_0> *)&data,other);
      pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&data,0);
      if (*pSVar2 <= local_70 && local_70 != *pSVar2) {
        pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&data,0);
        local_70 = *pSVar2;
        min = local_70;
      }
      pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&data,1);
      if (*pSVar2 <= local_70 && local_70 != *pSVar2) {
        pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&data,1);
        local_70 = *pSVar2;
        min = local_70;
      }
      pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&data,2);
      if (*pSVar2 <= local_70 && local_70 != *pSVar2) {
        pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&data,2);
        local_70 = *pSVar2;
        min = local_70;
      }
      pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&data,0);
      if (local_78 < *pSVar2) {
        pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&data,0);
        local_78 = *pSVar2;
        max = local_78;
      }
      pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&data,1);
      if (local_78 < *pSVar2) {
        pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&data,1);
        local_78 = *pSVar2;
        max = local_78;
      }
      pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&data,2);
      if (local_78 < *pSVar2) {
        pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&data,2);
        local_78 = *pSVar2;
        max = local_78;
      }
      free((void *)CONCAT44(data.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                            m_storage.m_data._4_4_,
                            data.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                            m_storage.m_data._0_4_));
    }
  }
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::CommaInitializer
            ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&data,
             (Matrix<double,__1,_1,_0,__1,_1> *)local_58,&min);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
            ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&data,&max);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::finished
            ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&data);
  vVar4.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       extraout_RDX;
  vVar4.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)ppVar1;
  return (vector)vVar4.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

vector calc_minmax(){
                using namespace std;
                vector ret(2);
                double min = std::numeric_limits<double>::infinity();
                double max = -std::numeric_limits<double>::infinity();

                for(int i = 0; i < m_iWidth; i++) {
                    for(int j = 0; j < m_iHeight; j++) {
                        vector data = m_aArray(i,j);
                        if(data[0] < min) min = data[0];
                        if(data[1] < min) min = data[1];
                        if(data[2] < min) min = data[2];
                        if(data[0] > max) max = data[0];
                        if(data[1] > max) max = data[1];
                        if(data[2] > max) max = data[2];
                    }
                }
                ret << min, max;
                return ret;
            }